

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

void __thiscall
Memory::HeapBlockMap32::SetPageMarkCount(HeapBlockMap32 *this,void *address,ushort markCount)

{
  L2MapChunk *this_00;
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  BVStatic<256UL> *this_01;
  uint uVar5;
  undefined8 *in_FS_OFFSET;
  
  this_00 = this->map[(ulong)address >> 0x14 & 0xfff];
  if (this_00 == (L2MapChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x143,"(l2map != nullptr)","l2map != nullptr");
    if (!bVar3) goto LAB_00214977;
    *puVar1 = 0;
  }
  uVar5 = (uint)address >> 0xc & 0xff;
  this_01 = BVStatic<65536ul>::GetRange<256ul>((BVStatic<65536ul> *)this_00,uVar5 << 8);
  BVar4 = BVStatic<256UL>::Count(this_01);
  if (BVar4 != markCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x14e,"(l2map->GetPageMarkBitVector(id2)->Count() == markCount)",
                       "l2map->GetPageMarkBitVector(id2)->Count() == markCount");
    if (!bVar3) {
LAB_00214977:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  this_00->pageMarkCount[uVar5] = markCount;
  return;
}

Assistant:

void
HeapBlockMap32::SetPageMarkCount(void * address, ushort markCount)
{
    uint id1 = GetLevel1Id(address);

    L2MapChunk * l2map = map[id1];
    Assert(l2map != nullptr);

    uint id2 = GetLevel2Id(address);

    // Callers should already have updated the mark bits by the time they call this,
    // so check that the new count is correct for the current mark bits.
    // Not true right now, will be true...
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    DebugOnly(HeapBlock * heapBlock = this->GetHeapBlock(address));
    Assert(l2map->GetPageMarkBitVector(id2)->Count() == markCount || heapBlock->WasAllocatedFromDuringSweep());
#else
    Assert(l2map->GetPageMarkBitVector(id2)->Count() == markCount);
#endif

    l2map->pageMarkCount[id2] = markCount;
}